

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++.cc
# Opt level: O2

Status __thiscall
osqp::OsqpSolver::UpdateObjectiveMatrix
          (OsqpSolver *this,SparseMatrix<double,_0,_long_long> *objective_matrix)

{
  bool bVar1;
  SparseMatrix<double,_0,_long_long> *in_RDX;
  SparseMatrix<double,_0,_long_long> objective_matrix_upper_triangle;
  SparseMatrixBase<Eigen::TriangularView<const_Eigen::SparseMatrix<double,_0,_long_long>,_2U>_>
  local_70 [16];
  SparseMatrix<double,_0,_long_long> local_60;
  
  bVar1 = anon_unknown_6::IsUpperTriangular(in_RDX);
  if (bVar1) {
    anon_unknown_6::UpdateUpperTriangularObjectiveMatrix
              ((anon_unknown_6 *)this,in_RDX,*(OSQPWorkspaceHelper **)objective_matrix);
  }
  else {
    local_70[0].m_isRValue = false;
    Eigen::SparseMatrix<double,0,long_long>::
    SparseMatrix<Eigen::TriangularView<Eigen::SparseMatrix<double,0,long_long>const,2u>>
              ((SparseMatrix<double,0,long_long> *)&local_60,local_70);
    anon_unknown_6::UpdateUpperTriangularObjectiveMatrix
              ((anon_unknown_6 *)this,&local_60,*(OSQPWorkspaceHelper **)objective_matrix);
    Eigen::SparseMatrix<double,_0,_long_long>::~SparseMatrix(&local_60);
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status OsqpSolver::UpdateObjectiveMatrix(
    const Eigen::SparseMatrix<double, Eigen::ColMajor, c_int>&
        objective_matrix) {
  // If the objective matrix is already upper triangular, we can skip the
  // temporary.
  if (IsUpperTriangular(objective_matrix)) {
    return UpdateUpperTriangularObjectiveMatrix(objective_matrix,
                                                workspace_.get());
  }

  // If not upper triangular, make a temporary.
  Eigen::SparseMatrix<double, Eigen::ColMajor, c_int>
      objective_matrix_upper_triangle =
          objective_matrix.triangularView<Eigen::Upper>();
  return UpdateUpperTriangularObjectiveMatrix(objective_matrix_upper_triangle,
                                              workspace_.get());
}